

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O2

uint32_t ucptrie_get_63(UCPTrie *trie,UChar32 c)

{
  uint32_t uVar1;
  uint uVar2;
  
  if (0x7f < (uint)c) {
    uVar2 = 0xfff;
    if (trie->type == '\0') {
      uVar2 = 0xffff;
    }
    if (uVar2 < (uint)c) {
      if ((uint)c < 0x110000) {
        if (c < trie->highStart) {
          c = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          c = trie->dataLength + -2;
        }
      }
      else {
        c = trie->dataLength + -1;
      }
    }
    else {
      c = (c & 0x3fU) + (uint)trie->index[(uint)c >> 6];
    }
  }
  uVar1 = anon_unknown.dwarf_285d1e::getValue(trie->data,(int)trie->valueWidth,c);
  return uVar1;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
ucptrie_get(const UCPTrie *trie, UChar32 c) {
    int32_t dataIndex;
    if ((uint32_t)c <= 0x7f) {
        // linear ASCII
        dataIndex = c;
    } else {
        UChar32 fastMax = trie->type == UCPTRIE_TYPE_FAST ? 0xffff : UCPTRIE_SMALL_MAX;
        dataIndex = _UCPTRIE_CP_INDEX(trie, fastMax, c);
    }
    return getValue(trie->data, (UCPTrieValueWidth)trie->valueWidth, dataIndex);
}